

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

hugeint_t duckdb::TryCastCInternal<short,duckdb::hugeint_t,duckdb::TryCast>
                    (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  hugeint_t hVar2;
  hugeint_t result_value;
  hugeint_t local_40;
  hugeint_t local_30 [2];
  
  bVar1 = TryCast::Operation<short,duckdb::hugeint_t>
                    (*(int16_t *)((long)result->deprecated_columns[col].deprecated_data + row * 2),
                     &local_40,false);
  if (!bVar1) {
    hugeint_t::hugeint_t(local_30,0);
    local_40.lower = local_30[0].lower;
    local_40.upper = local_30[0].upper;
  }
  hVar2.upper = local_40.upper;
  hVar2.lower = local_40.lower;
  return hVar2;
}

Assistant:

void *UnsafeFetchPtr(duckdb_result *result, idx_t col, idx_t row) {
	D_ASSERT(row < result->deprecated_row_count);
	return (void *)&(((T *)result->deprecated_columns[col].deprecated_data)[row]);
}